

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

error_code __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
set_option_no_delay(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>
                    *this,bool b,error_code *ec)

{
  error_code eVar1;
  error_code eVar2;
  boolean<6,_1> local_4;
  error_category *peVar3;
  
  eVar1 = asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::
          set_option<asio::detail::socket_option::boolean<6,1>>
                    ((basic_socket<asio::ip::tcp,asio::any_io_executor> *)&this->socket_,&local_4,ec
                    );
  eVar2._M_value = eVar1._M_value;
  eVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return eVar2;
}

Assistant:

std::error_code set_option_no_delay(bool b, std::error_code& ec)
    {
        return set_option(asio::ip::tcp::no_delay(b), ec);
    }